

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O3

void __thiscall wasm::ModuleUtils::anon_unknown_1::Counts::include(Counts *this,Type type)

{
  pointer pHVar1;
  Type local_58;
  Type type_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_40;
  
  local_58.id = type.id;
  wasm::Type::getHeapTypeChildren(&local_40,&local_58);
  if (local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pHVar1 = local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0xd < pHVar1->id) {
        type_local.id = pHVar1->id;
        InsertOrderedMap<wasm::HeapType,_unsigned_long>::insert
                  (&this->super_InsertOrderedMap<wasm::HeapType,_unsigned_long>,
                   (pair<const_wasm::HeapType,_unsigned_long> *)&type_local);
      }
      pHVar1 = pHVar1 + 1;
    } while (pHVar1 != local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void include(Type type) {
    for (HeapType ht : type.getHeapTypeChildren()) {
      include(ht);
    }
  }